

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_0::HeapTypeInfo::HeapTypeInfo(HeapTypeInfo *this,Array *array)

{
  Array *array_local;
  HeapTypeInfo *this_local;
  
  this->isTemp = false;
  this->isFinalized = true;
  this->supertype = (HeapTypeInfo *)0x0;
  this->recGroup = (RecGroupInfo *)0x0;
  this->recGroupIndex = 0;
  this->kind = ArrayKind;
  Array::Array(&(this->field_6).array,array);
  return;
}

Assistant:

HeapTypeInfo(Array array) : kind(ArrayKind), array(array) {}